

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_to(basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
       basic_json_visitor<char> *visitor)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  undefined8 in_RSI;
  long *in_RDI;
  error_code ec;
  error_code *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffffb8;
  ser_error *in_stack_ffffffffffffffc0;
  error_code local_20;
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::error_code::error_code(in_stack_ffffffffffffff90);
  (**(code **)(*in_RDI + 0x30))(in_RDI,local_10,&local_20);
  bVar1 = std::error_code::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x58);
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::line
            ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)
             (in_RDI + 1));
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::column
            ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)
             0x2df0e9);
  ec_00._M_cat = local_20._M_cat;
  ec_00._M_value = local_20._M_value;
  ec_00._4_4_ = local_20._4_4_;
  ser_error::ser_error(in_stack_ffffffffffffffc0,ec_00,in_stack_ffffffffffffffb8,(size_t)in_RDI);
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void read_to(basic_json_visitor<char_type>& visitor) override
    {
        std::error_code ec;
        read_to(visitor, ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec,parser_.line(),parser_.column()));
        }
    }